

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PlyDecoder::DecodeVertexData
          (Status *__return_storage_ptr__,PlyDecoder *this,PlyElement *vertex_element)

{
  DataType dt;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  size_t sVar2;
  uchar uVar3;
  int32_t iVar4;
  int iVar5;
  PlyProperty *pPVar6;
  PlyProperty *pPVar7;
  PlyProperty *pPVar8;
  ulong uVar9;
  PlyProperty *property;
  DataBuffer *pDVar10;
  uint uVar11;
  ValueType i;
  int __args;
  ulong uVar12;
  ValueType num_attribute_values;
  int j;
  uint uVar13;
  long lVar14;
  GeometryAttribute va;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> properties;
  PlyProperty *y_prop;
  PlyProperty *x_prop;
  array<float,_3UL> val;
  PlyPropertyReader<float> y_reader;
  PlyProperty *z_prop;
  PlyPropertyReader<float> z_reader;
  
  if (vertex_element == (PlyElement *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&va,"vertex_element is null",(allocator<char> *)&properties);
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
LAB_00111d76:
    std::__cxx11::string::~string((string *)&va);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"x",(allocator<char> *)&properties);
  pPVar6 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  x_prop = pPVar6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"y",(allocator<char> *)&properties);
  pPVar6 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  y_prop = pPVar6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"z",(allocator<char> *)&properties);
  pPVar6 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  z_prop = pPVar6;
  if (((pPVar6 == (PlyProperty *)0x0) || (x_prop == (PlyProperty *)0x0)) ||
     (y_prop == (PlyProperty *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&va,"x, y, or z property is missing",(allocator<char> *)&properties);
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    goto LAB_00111d76;
  }
  uVar9 = vertex_element->num_entries_;
  num_attribute_values = (ValueType)uVar9;
  this->out_point_cloud_->num_points_ = num_attribute_values;
  dt = x_prop->data_type_;
  if ((dt != y_prop->data_type_) || (dt != pPVar6->data_type_)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&va,"x, y, and z properties must have the same type",
               (allocator<char> *)&properties);
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    goto LAB_00111d76;
  }
  if ((dt == DT_INT32) || (dt == DT_FLOAT32)) {
    GeometryAttribute::GeometryAttribute(&va);
    iVar4 = DataTypeLength(dt);
    GeometryAttribute::Init(&va,POSITION,(DataBuffer *)0x0,'\x03',dt,false,(long)(iVar4 * 3),0);
    iVar5 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,num_attribute_values);
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
              (&properties,&x_prop);
    std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
              (&properties,&y_prop);
    std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::push_back
              (&properties,&z_prop);
    if (dt == DT_INT32) {
      ReadPropertiesToAttribute<int>
                (this,&properties,
                 (PointAttribute *)
                 (this->out_point_cloud_->attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t,num_attribute_values);
    }
    else if (dt == DT_FLOAT32) {
      ReadPropertiesToAttribute<float>
                (this,&properties,
                 (PointAttribute *)
                 (this->out_point_cloud_->attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t,num_attribute_values);
    }
    std::_Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::
    ~_Vector_base(&properties.
                   super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                 );
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&va,"x, y, and z properties must be of type float32 or int32",
               (allocator<char> *)&properties);
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    std::__cxx11::string::~string((string *)&va);
  }
  if ((dt != DT_FLOAT32) && (dt != DT_INT32)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"nx",(allocator<char> *)&properties);
  pPVar6 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"ny",(allocator<char> *)&properties);
  pPVar7 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"nz",(allocator<char> *)&properties);
  pPVar8 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  uVar9 = uVar9 & 0xffffffff;
  std::__cxx11::string::~string((string *)&va);
  if ((((pPVar8 != (PlyProperty *)0x0 &&
         (pPVar7 != (PlyProperty *)0x0 && pPVar6 != (PlyProperty *)0x0)) &&
       (pPVar6->data_type_ == DT_FLOAT32)) && (pPVar7->data_type_ == DT_FLOAT32)) &&
     (pPVar8->data_type_ == DT_FLOAT32)) {
    PlyPropertyReader<float>::PlyPropertyReader((PlyPropertyReader<float> *)&properties,pPVar6);
    PlyPropertyReader<float>::PlyPropertyReader(&y_reader,pPVar7);
    PlyPropertyReader<float>::PlyPropertyReader(&z_reader,pPVar8);
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,NORMAL,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
    iVar5 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,num_attribute_values);
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      __args = (int)uVar12;
      val._M_elems[0] =
           std::function<float_(int)>::operator()
                     ((function<float_(int)> *)
                      &properties.
                       super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__args);
      val._M_elems[1] = std::function<float_(int)>::operator()(&y_reader.convert_value_func_,__args)
      ;
      val._M_elems[2] = std::function<float_(int)>::operator()(&z_reader.convert_value_func_,__args)
      ;
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->out_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar2 = *(size_t *)
               ((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(sVar2 * uVar12 +
                     **(long **)_Var1._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&val,sVar2);
    }
    std::_Function_base::~_Function_base(&z_reader.convert_value_func_.super__Function_base);
    std::_Function_base::~_Function_base(&y_reader.convert_value_func_.super__Function_base);
    std::_Function_base::~_Function_base
              ((_Function_base *)
               &properties.
                super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"red",(allocator<char> *)&properties);
  pPVar6 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"green",(allocator<char> *)&properties);
  pPVar7 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"blue",(allocator<char> *)&properties);
  pPVar8 = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"alpha",(allocator<char> *)&properties);
  property = PlyElement::GetPropertyByName(vertex_element,(string *)&va);
  std::__cxx11::string::~string((string *)&va);
  uVar11 = (pPVar6 != (PlyProperty *)0x0) + 1;
  if (pPVar7 == (PlyProperty *)0x0) {
    uVar11 = (uint)(pPVar6 != (PlyProperty *)0x0);
  }
  uVar13 = (uint)(property != (PlyProperty *)0x0) +
           ((uVar11 + 1) - (uint)(pPVar8 == (PlyProperty *)0x0));
  if (uVar13 != 0) {
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    properties.
    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pPVar6 != (PlyProperty *)0x0) {
      if (pPVar6->data_type_ != DT_UINT8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&va,"Type of \'red\' property must be uint8",
                   (allocator<char> *)&y_reader);
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
        goto LAB_001123dd;
      }
      pDVar10 = (DataBuffer *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)pDVar10,pPVar6);
      va.buffer_ = pDVar10;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                  *)&properties,
                 (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)&va);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)&va);
    }
    if (pPVar7 != (PlyProperty *)0x0) {
      if (pPVar7->data_type_ != DT_UINT8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&va,"Type of \'green\' property must be uint8",
                   (allocator<char> *)&y_reader);
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
        goto LAB_001123dd;
      }
      pDVar10 = (DataBuffer *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)pDVar10,pPVar7);
      va.buffer_ = pDVar10;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                  *)&properties,
                 (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)&va);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)&va);
    }
    if (pPVar8 != (PlyProperty *)0x0) {
      if (pPVar8->data_type_ != DT_UINT8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&va,"Type of \'blue\' property must be uint8",
                   (allocator<char> *)&y_reader);
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
        goto LAB_001123dd;
      }
      pDVar10 = (DataBuffer *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)pDVar10,pPVar8);
      va.buffer_ = pDVar10;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                  *)&properties,
                 (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)&va);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)&va);
    }
    if (property != (PlyProperty *)0x0) {
      if (property->data_type_ != DT_UINT8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&va,"Type of \'alpha\' property must be uint8",
                   (allocator<char> *)&y_reader);
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
LAB_001123dd:
        std::__cxx11::string::~string((string *)&va);
        std::
        vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
        ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)&properties);
        return __return_storage_ptr__;
      }
      pDVar10 = (DataBuffer *)operator_new(0x28);
      PlyPropertyReader<unsigned_char>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_char> *)pDVar10,property);
      va.buffer_ = pDVar10;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
      ::
      emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                  *)&properties,
                 (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                  *)&va);
      std::
      unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
      ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                     *)&va);
    }
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init
              (&va,COLOR,(DataBuffer *)0x0,(uint8_t)uVar13,DT_UINT8,true,(ulong)uVar13,0);
    iVar5 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,num_attribute_values);
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      for (lVar14 = 0;
          (((ulong)uVar11 - (ulong)(property == (PlyProperty *)0x0)) + 2) -
          (ulong)(pPVar8 == (PlyProperty *)0x0) != lVar14; lVar14 = lVar14 + 1) {
        uVar3 = std::function<unsigned_char_(int)>::operator()
                          ((function<unsigned_char_(int)> *)
                           &(properties.
                             super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar14]->name_).
                            _M_string_length,(int)uVar12);
        *(uchar *)((long)&y_reader.property_ + lVar14) = uVar3;
      }
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->out_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar2 = *(size_t *)
               ((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(sVar2 * uVar12 +
                     **(long **)_Var1._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&y_reader,sVar2);
    }
    std::
    vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
    ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
               *)&properties);
  }
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeVertexData(const PlyElement *vertex_element) {
  if (vertex_element == nullptr) {
    return Status(Status::INVALID_PARAMETER, "vertex_element is null");
  }
  // TODO(b/34330853): For now, try to load x,y,z vertices, red,green,blue,alpha
  // colors, and nx,ny,nz normals. We need to add other properties later.
  const PlyProperty *const x_prop = vertex_element->GetPropertyByName("x");
  const PlyProperty *const y_prop = vertex_element->GetPropertyByName("y");
  const PlyProperty *const z_prop = vertex_element->GetPropertyByName("z");
  if (!x_prop || !y_prop || !z_prop) {
    // Currently, we require 3 vertex coordinates (this should be generalized
    // later on).
    return Status(Status::INVALID_PARAMETER, "x, y, or z property is missing");
  }
  const PointIndex::ValueType num_vertices = vertex_element->num_entries();
  out_point_cloud_->set_num_points(num_vertices);
  // Decode vertex positions.
  {
    // All properties must have the same type.
    if (x_prop->data_type() != y_prop->data_type() ||
        y_prop->data_type() != z_prop->data_type()) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must have the same type");
    }
    // TODO(ostava): For now assume the position types are float32 or int32.
    const DataType dt = x_prop->data_type();
    if (dt != DT_FLOAT32 && dt != DT_INT32) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must be of type float32 or int32");
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, dt, false,
            DataTypeLength(dt) * 3, 0);
    const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
    std::vector<const PlyProperty *> properties;
    properties.push_back(x_prop);
    properties.push_back(y_prop);
    properties.push_back(z_prop);
    if (dt == DT_FLOAT32) {
      ReadPropertiesToAttribute<float>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    } else if (dt == DT_INT32) {
      ReadPropertiesToAttribute<int32_t>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    }
  }

  // Decode normals if present.
  const PlyProperty *const n_x_prop = vertex_element->GetPropertyByName("nx");
  const PlyProperty *const n_y_prop = vertex_element->GetPropertyByName("ny");
  const PlyProperty *const n_z_prop = vertex_element->GetPropertyByName("nz");
  if (n_x_prop != nullptr && n_y_prop != nullptr && n_z_prop != nullptr) {
    // For now, all normal properties must be set and of type float32
    if (n_x_prop->data_type() == DT_FLOAT32 &&
        n_y_prop->data_type() == DT_FLOAT32 &&
        n_z_prop->data_type() == DT_FLOAT32) {
      PlyPropertyReader<float> x_reader(n_x_prop);
      PlyPropertyReader<float> y_reader(n_y_prop);
      PlyPropertyReader<float> z_reader(n_z_prop);
      GeometryAttribute va;
      va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
              sizeof(float) * 3, 0);
      const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
      for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
        std::array<float, 3> val;
        val[0] = x_reader.ReadValue(i);
        val[1] = y_reader.ReadValue(i);
        val[2] = z_reader.ReadValue(i);
        out_point_cloud_->attribute(att_id)->SetAttributeValue(
            AttributeValueIndex(i), &val[0]);
      }
    }
  }

  // Decode color data if present.
  int num_colors = 0;
  const PlyProperty *const r_prop = vertex_element->GetPropertyByName("red");
  const PlyProperty *const g_prop = vertex_element->GetPropertyByName("green");
  const PlyProperty *const b_prop = vertex_element->GetPropertyByName("blue");
  const PlyProperty *const a_prop = vertex_element->GetPropertyByName("alpha");
  if (r_prop) {
    ++num_colors;
  }
  if (g_prop) {
    ++num_colors;
  }
  if (b_prop) {
    ++num_colors;
  }
  if (a_prop) {
    ++num_colors;
  }

  if (num_colors) {
    std::vector<std::unique_ptr<PlyPropertyReader<uint8_t>>> color_readers;
    const PlyProperty *p;
    if (r_prop) {
      p = r_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'red' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (g_prop) {
      p = g_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'green' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (b_prop) {
      p = b_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'blue' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (a_prop) {
      p = a_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'alpha' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::COLOR, nullptr, num_colors, DT_UINT8, true,
            sizeof(uint8_t) * num_colors, 0);
    const int32_t att_id =
        out_point_cloud_->AddAttribute(va, true, num_vertices);
    for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
      std::array<uint8_t, 4> val;
      for (int j = 0; j < num_colors; j++) {
        val[j] = color_readers[j]->ReadValue(i);
      }
      out_point_cloud_->attribute(att_id)->SetAttributeValue(
          AttributeValueIndex(i), &val[0]);
    }
  }

  return OkStatus();
}